

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_dispatch.cpp
# Opt level: O2

void ResetButtonStates(void)

{
  FButtonStatus *this;
  int i;
  uint uVar1;
  
  for (uVar1 = 0x1f; -1 < (int)uVar1; uVar1 = uVar1 - 1) {
    this = ActionMaps[uVar1].Button;
    if (this != &Button_Klook && this != &Button_Mlook) {
      FButtonStatus::ReleaseKey(this,0);
    }
    this->bWentDown = '\0';
    this->bWentUp = '\0';
  }
  return;
}

Assistant:

void ResetButtonStates ()
{
	for (int i = NUM_ACTIONS-1; i >= 0; --i)
	{
		FButtonStatus *button = ActionMaps[i].Button;

		if (button != &Button_Mlook && button != &Button_Klook)
		{
			button->ReleaseKey (0);
		}
		button->ResetTriggers ();
	}
}